

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmVariableWatchCommand.cxx
# Opt level: O0

void cmVariableWatchCommandVariableAccessed
               (string *variable,int access_type,void *client_data,char *newValue,cmMakefile *mf)

{
  long *this;
  undefined8 this_00;
  bool bVar1;
  char *pcVar2;
  ulong uVar3;
  ostream *poVar4;
  char *local_588;
  char *local_530;
  string local_4d8;
  undefined1 local_4b8 [8];
  ostringstream msg;
  string local_338;
  undefined1 local_318 [8];
  ostringstream error;
  cmExecutionStatus local_19c;
  int local_198;
  cmExecutionStatus status;
  int local_190 [4];
  char *local_180;
  int local_174 [4];
  allocator<char> local_162;
  allocator<char> local_161;
  string local_160;
  undefined1 local_140 [8];
  string stack;
  cmMakefile *makefile;
  string local_110;
  char *local_f0;
  char *currentListFile;
  char *local_d8;
  char *accessString;
  undefined1 local_c8 [7];
  bool processed;
  cmListFileArgument arg;
  cmListFileFunction newLFF;
  cmVariableWatchCallbackData *data;
  cmMakefile *mf_local;
  char *newValue_local;
  void *client_data_local;
  int access_type_local;
  string *variable_local;
  
  if ((*client_data & 1) != 0) {
    return;
  }
  *(undefined1 *)client_data = 1;
  newLFF.Arguments.super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)client_data;
  cmListFileFunction::cmListFileFunction((cmListFileFunction *)&arg.Line);
  cmListFileArgument::cmListFileArgument((cmListFileArgument *)local_c8);
  accessString._7_1_ = 0;
  local_d8 = cmVariableWatch::GetAccessAsString(access_type);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_110,"CMAKE_CURRENT_LIST_FILE",(allocator<char> *)((long)&makefile + 7)
            );
  pcVar2 = cmMakefile::GetDefinition(mf,&local_110);
  std::__cxx11::string::~string((string *)&local_110);
  std::allocator<char>::~allocator((allocator<char> *)((long)&makefile + 7));
  stack.field_2._8_8_ = mf;
  local_f0 = pcVar2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_160,"LISTFILE_STACK",&local_161);
  pcVar2 = cmMakefile::GetProperty(mf,&local_160);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_140,pcVar2,&local_162);
  std::allocator<char>::~allocator(&local_162);
  std::__cxx11::string::~string((string *)&local_160);
  std::allocator<char>::~allocator(&local_161);
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    this = &newLFF.super_cmCommandContext.Line;
    std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::clear
              ((vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> *)this);
    local_174[3] = 1;
    local_174[2] = 9999;
    std::vector<cmListFileArgument,std::allocator<cmListFileArgument>>::
    emplace_back<std::__cxx11::string_const&,cmListFileArgument::Delimiter,int>
              ((vector<cmListFileArgument,std::allocator<cmListFileArgument>> *)this,variable,
               (Delimiter *)(local_174 + 3),local_174 + 2);
    local_174[1] = 1;
    local_174[0] = 9999;
    std::vector<cmListFileArgument,std::allocator<cmListFileArgument>>::
    emplace_back<char_const*&,cmListFileArgument::Delimiter,int>
              ((vector<cmListFileArgument,std::allocator<cmListFileArgument>> *)
               &newLFF.super_cmCommandContext.Line,&local_d8,(Delimiter *)(local_174 + 1),local_174)
    ;
    local_530 = newValue;
    if (newValue == (char *)0x0) {
      local_530 = "";
    }
    local_180 = local_530;
    local_190[3] = 1;
    local_190[2] = 9999;
    std::vector<cmListFileArgument,std::allocator<cmListFileArgument>>::
    emplace_back<char_const*,cmListFileArgument::Delimiter,int>
              ((vector<cmListFileArgument,std::allocator<cmListFileArgument>> *)
               &newLFF.super_cmCommandContext.Line,&local_180,(Delimiter *)(local_190 + 3),
               local_190 + 2);
    local_190[1] = 1;
    local_190[0] = 9999;
    std::vector<cmListFileArgument,std::allocator<cmListFileArgument>>::
    emplace_back<char_const*&,cmListFileArgument::Delimiter,int>
              ((vector<cmListFileArgument,std::allocator<cmListFileArgument>> *)
               &newLFF.super_cmCommandContext.Line,&local_f0,(Delimiter *)(local_190 + 1),local_190)
    ;
    status.ReturnInvoked = true;
    status.BreakInvoked = false;
    status.ContinueInvoked = false;
    status.NestedError = false;
    local_198 = 9999;
    std::vector<cmListFileArgument,std::allocator<cmListFileArgument>>::
    emplace_back<std::__cxx11::string&,cmListFileArgument::Delimiter,int>
              ((vector<cmListFileArgument,std::allocator<cmListFileArgument>> *)
               &newLFF.super_cmCommandContext.Line,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_140,
               (Delimiter *)&status,&local_198);
    cmCommandContext::cmCommandName::operator=
              ((cmCommandName *)&arg.Line,
               (string *)
               &((newLFF.Arguments.
                  super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage)->Value)._M_string_length);
    newLFF.super_cmCommandContext.Name.Original.field_2._8_8_ = 9999;
    cmExecutionStatus::cmExecutionStatus(&local_19c);
    bVar1 = cmMakefile::ExecuteCommand
                      ((cmMakefile *)stack.field_2._8_8_,(cmListFileFunction *)&arg.Line,&local_19c)
    ;
    if (!bVar1) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_318);
      poVar4 = std::operator<<((ostream *)local_318,"Error in cmake code at\nUnknown:0:\n");
      poVar4 = std::operator<<(poVar4,"A command failed during the invocation of callback \"");
      poVar4 = std::operator<<(poVar4,(string *)
                                      &((newLFF.Arguments.
                                         super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage)->Value)
                                       ._M_string_length);
      std::operator<<(poVar4,"\".");
      std::__cxx11::ostringstream::str();
      cmSystemTools::Error(&local_338);
      std::__cxx11::string::~string((string *)&local_338);
      ((newLFF.Arguments.super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage)->Value)._M_dataplus = (_Alloc_hider)0x0;
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_318);
      goto LAB_00287337;
    }
    accessString._7_1_ = 1;
  }
  if ((accessString._7_1_ & 1) == 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4b8);
    poVar4 = std::operator<<((ostream *)local_4b8,"Variable \"");
    poVar4 = std::operator<<(poVar4,(string *)variable);
    poVar4 = std::operator<<(poVar4,"\" was accessed using ");
    poVar4 = std::operator<<(poVar4,local_d8);
    poVar4 = std::operator<<(poVar4," with value \"");
    local_588 = newValue;
    if (newValue == (char *)0x0) {
      local_588 = "";
    }
    poVar4 = std::operator<<(poVar4,local_588);
    std::operator<<(poVar4,"\".");
    this_00 = stack.field_2._8_8_;
    std::__cxx11::ostringstream::str();
    cmMakefile::IssueMessage((cmMakefile *)this_00,LOG,&local_4d8);
    std::__cxx11::string::~string((string *)&local_4d8);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4b8);
  }
  ((newLFF.Arguments.super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage)->Value)._M_dataplus = (_Alloc_hider)0x0;
LAB_00287337:
  std::__cxx11::string::~string((string *)local_140);
  cmListFileArgument::~cmListFileArgument((cmListFileArgument *)local_c8);
  cmListFileFunction::~cmListFileFunction((cmListFileFunction *)&arg.Line);
  return;
}

Assistant:

static void cmVariableWatchCommandVariableAccessed(const std::string& variable,
                                                   int access_type,
                                                   void* client_data,
                                                   const char* newValue,
                                                   const cmMakefile* mf)
{
  cmVariableWatchCallbackData* data =
    static_cast<cmVariableWatchCallbackData*>(client_data);

  if (data->InCallback) {
    return;
  }
  data->InCallback = true;

  cmListFileFunction newLFF;
  cmListFileArgument arg;
  bool processed = false;
  const char* accessString = cmVariableWatch::GetAccessAsString(access_type);
  const char* currentListFile = mf->GetDefinition("CMAKE_CURRENT_LIST_FILE");

  /// Ultra bad!!
  cmMakefile* makefile = const_cast<cmMakefile*>(mf);

  std::string stack = makefile->GetProperty("LISTFILE_STACK");
  if (!data->Command.empty()) {
    newLFF.Arguments.clear();
    newLFF.Arguments.emplace_back(variable, cmListFileArgument::Quoted, 9999);
    newLFF.Arguments.emplace_back(accessString, cmListFileArgument::Quoted,
                                  9999);
    newLFF.Arguments.emplace_back(newValue ? newValue : "",
                                  cmListFileArgument::Quoted, 9999);
    newLFF.Arguments.emplace_back(currentListFile, cmListFileArgument::Quoted,
                                  9999);
    newLFF.Arguments.emplace_back(stack, cmListFileArgument::Quoted, 9999);
    newLFF.Name = data->Command;
    newLFF.Line = 9999;
    cmExecutionStatus status;
    if (!makefile->ExecuteCommand(newLFF, status)) {
      std::ostringstream error;
      error << "Error in cmake code at\nUnknown:0:\n"
            << "A command failed during the invocation of callback \""
            << data->Command << "\".";
      cmSystemTools::Error(error.str());
      data->InCallback = false;
      return;
    }
    processed = true;
  }
  if (!processed) {
    std::ostringstream msg;
    msg << "Variable \"" << variable << "\" was accessed using "
        << accessString << " with value \"" << (newValue ? newValue : "")
        << "\".";
    makefile->IssueMessage(MessageType::LOG, msg.str());
  }

  data->InCallback = false;
}